

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O0

void Abc_NtkModelToVector(Abc_Ntk_t *pNtk,Vec_Int_t *vPiValues)

{
  int *piVar1;
  int iVar2;
  int local_24;
  int i;
  int *pModel;
  Vec_Int_t *vPiValues_local;
  Abc_Ntk_t *pNtk_local;
  
  piVar1 = pNtk->pModel;
  local_24 = 0;
  while( true ) {
    iVar2 = Abc_NtkPiNum(pNtk);
    if (iVar2 <= local_24) break;
    Vec_IntWriteEntry(vPiValues,local_24,piVar1[local_24]);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Abc_NtkModelToVector( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues )
{
    int * pModel, i;
    pModel = pNtk->pModel;
    for ( i = 0; i < Abc_NtkPiNum(pNtk); i++ )
        Vec_IntWriteEntry( vPiValues, i, pModel[i] );
}